

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Core.c
# Opt level: O0

int Llb_ManModelCheckAig
              (Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars,Vec_Int_t *vHints,DdManager **pddGlo)

{
  abctime aVar1;
  abctime aVar2;
  abctime clk;
  Aig_Man_t *pAStack_38;
  int RetValue;
  Aig_Man_t *pAig;
  Llb_Man_t *p;
  DdManager **pddGlo_local;
  Vec_Int_t *vHints_local;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAigGlo_local;
  
  pAig = (Aig_Man_t *)0x0;
  clk._4_4_ = -1;
  pddGlo_local = (DdManager **)vHints;
  vHints_local = (Vec_Int_t *)pPars;
  pPars_local = (Gia_ParLlb_t *)pAigGlo;
  aVar1 = Abc_Clock();
  if (*(int *)((long)&vHints_local[2].pArray + 4) != 0) {
    if (pddGlo_local != (DdManager **)0x0) {
      __assert_fail("vHints == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Core.c"
                    ,0x79,
                    "int Llb_ManModelCheckAig(Aig_Man_t *, Gia_ParLlb_t *, Vec_Int_t *, DdManager **)"
                   );
    }
    pddGlo_local = (DdManager **)Llb_ManDeriveConstraints((Aig_Man_t *)pPars_local);
  }
  if (pddGlo_local == (DdManager **)0x0) {
    pAStack_38 = Aig_ManDupSimple((Aig_Man_t *)pPars_local);
  }
  else {
    if (vHints_local[4].nCap != 0) {
      Llb_ManPrintEntries((Aig_Man_t *)pPars_local,(Vec_Int_t *)pddGlo_local);
    }
    pAStack_38 = Aig_ManDupSimpleWithHints((Aig_Man_t *)pPars_local,(Vec_Int_t *)pddGlo_local);
  }
  if (vHints_local[1].nSize == 0) {
    pAig = (Aig_Man_t *)
           Llb_ManStart((Aig_Man_t *)pPars_local,pAStack_38,(Gia_ParLlb_t *)vHints_local);
    if (vHints_local[4].nCap != 0) {
      Llb_ManPrintAig((Llb_Man_t *)pAig);
      printf("Original matrix:          ");
      Llb_MtrPrintMatrixStats((Llb_Mtr_t *)(pAig->Ghost).pFanin1);
      if (vHints_local[4].nSize != 0) {
        Llb_MtrPrint((Llb_Mtr_t *)(pAig->Ghost).pFanin1,1);
      }
    }
    if ((vHints_local[3].nSize != 0) &&
       (Llb_ManCluster((Llb_Mtr_t *)(pAig->Ghost).pFanin1), vHints_local[4].nCap != 0)) {
      printf("Matrix after clustering:  ");
      Llb_MtrPrintMatrixStats((Llb_Mtr_t *)(pAig->Ghost).pFanin1);
      if (vHints_local[4].nSize != 0) {
        Llb_MtrPrint((Llb_Mtr_t *)(pAig->Ghost).pFanin1,1);
      }
    }
    if ((*(int *)&vHints_local[3].pArray != 0) &&
       (Llb_MtrSchedule((Llb_Mtr_t *)(pAig->Ghost).pFanin1), vHints_local[4].nCap != 0)) {
      printf("Matrix after scheduling:  ");
      Llb_MtrPrintMatrixStats((Llb_Mtr_t *)(pAig->Ghost).pFanin1);
      if (vHints_local[4].nSize != 0) {
        Llb_MtrPrint((Llb_Mtr_t *)(pAig->Ghost).pFanin1,1);
      }
    }
  }
  if (*(int *)(pAig->pName + 0x4c) == 0) {
    clk._4_4_ = Llb_ManReachability((Llb_Man_t *)pAig,(Vec_Int_t *)pddGlo_local,pddGlo);
  }
  Llb_ManStop((Llb_Man_t *)pAig);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  if (*(int *)((long)&vHints_local[2].pArray + 4) != 0) {
    Vec_IntFreeP((Vec_Int_t **)&pddGlo_local);
  }
  return clk._4_4_;
}

Assistant:

int Llb_ManModelCheckAig( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    Llb_Man_t * p = NULL; 
    Aig_Man_t * pAig;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    if ( pPars->fIndConstr )
    {
        assert( vHints == NULL );
        vHints = Llb_ManDeriveConstraints( pAigGlo );
    }

    // derive AIG for hints
    if ( vHints == NULL )
        pAig = Aig_ManDupSimple( pAigGlo );
    else
    {
        if ( pPars->fVerbose )
            Llb_ManPrintEntries( pAigGlo, vHints );
        pAig = Aig_ManDupSimpleWithHints( pAigGlo, vHints );
    }


    if ( pPars->fUseFlow )
    {
//        p = Llb_ManStartFlow( pAigGlo, pAig, pPars );
    }
    else
    {
        p = Llb_ManStart( pAigGlo, pAig, pPars );
        if ( pPars->fVerbose )
        {
            Llb_ManPrintAig( p );
            printf( "Original matrix:          " );
            Llb_MtrPrintMatrixStats( p->pMatrix );
            if ( pPars->fVeryVerbose )
                Llb_MtrPrint( p->pMatrix, 1 );
        }
        if ( pPars->fCluster )
        {
            Llb_ManCluster( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after clustering:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
        if ( pPars->fSchedule )
        {
            Llb_MtrSchedule( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after scheduling:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
    }
    
    if ( !p->pPars->fSkipReach ) 
        RetValue = Llb_ManReachability( p, vHints, pddGlo );
    Llb_ManStop( p );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( pPars->fIndConstr )
        Vec_IntFreeP( &vHints );
    return RetValue;
}